

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O3

void __thiscall Am_Value_List::Delete(Am_Value_List *this,bool unique)

{
  undefined1 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_List_Item *pAVar4;
  Am_List_Item **ppAVar5;
  Am_List_Item *this_00;
  Am_List_Item *pAVar6;
  Am_Value_List_Data *pAVar3;
  
  this_00 = this->item;
  if ((this_00 != (Am_List_Item *)0x0) && (pAVar3 = this->data, pAVar3 != (Am_Value_List_Data *)0x0)
     ) {
    if ((unique) && ((pAVar3->super_Am_Wrapper).refs != 1)) {
      iVar2 = (*(pAVar3->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])
                        (pAVar3);
      pAVar3 = (Am_Value_List_Data *)CONCAT44(extraout_var,iVar2);
      pAVar4 = this->item;
      if (pAVar4 == (Am_List_Item *)0x0) {
        this_00 = (Am_List_Item *)0x0;
      }
      else {
        ppAVar5 = &pAVar3->head;
        do {
          pAVar4 = pAVar4->prev;
          this_00 = *ppAVar5;
          ppAVar5 = &this_00->next;
        } while (pAVar4 != (Am_List_Item *)0x0);
        this->item = this_00;
      }
      this->data = pAVar3;
    }
    pAVar6 = this_00->prev;
    pAVar4 = this_00->next;
    ppAVar5 = &pAVar6->next;
    if (pAVar6 == (Am_List_Item *)0x0) {
      ppAVar5 = &pAVar3->head;
    }
    *ppAVar5 = pAVar4;
    if (pAVar4 == (Am_List_Item *)0x0) {
      pAVar3->tail = pAVar6;
    }
    else {
      pAVar4->prev = pAVar6;
      pAVar6 = this_00->prev;
    }
    Am_Value::~Am_Value(&this_00->super_Am_Value);
    operator_delete(this_00);
    this->item = pAVar6;
    puVar1 = &(this->data->super_Am_Wrapper).field_0xc;
    *(short *)puVar1 = *(short *)puVar1 + -1;
    return;
  }
  Am_Error("** Am_Value_List::Delete: no item is current\n");
}

Assistant:

void
Am_Value_List::Delete(bool unique)
{
  if (item && data) {
    if (unique)
      data->Make_Unique(data, item);
    if (item->prev)
      item->prev->next = item->next;
    else
      data->head = item->next;
    if (item->next)
      item->next->prev = item->prev;
    else
      data->tail = item->prev;
    Am_List_Item *new_item;
    new_item = item->prev;
    delete item;
    item = new_item;
    --data->number;
  } else
    Am_Error("** Am_Value_List::Delete: no item is current\n");
}